

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test *this)

{
  DescriptorPool *this_00;
  KeyValue *pKVar1;
  FieldDescriptor *this_01;
  byte bVar2;
  int iVar3;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_02;
  Descriptor *pDVar4;
  long lVar5;
  Message *this_03;
  CppStringType CVar6;
  int iVar7;
  FieldDescriptor *pFVar8;
  RepeatedPtrFieldBase *pRVar9;
  RepeatedPtrField<google::protobuf::Message> *pRVar10;
  Descriptor *this_04;
  ExtensionSet *pEVar11;
  SooRep *this_05;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar12;
  Nonnull<const_char_*> pcVar13;
  ulong extraout_RAX;
  undefined8 extraout_RAX_00;
  bool bVar14;
  Reflection *pRVar15;
  long lVar16;
  KeyValue *pKVar17;
  _func_int **message;
  KeyValue *pKVar18;
  uint uVar19;
  long lVar20;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  Metadata MVar21;
  AssertionResult gtest_ar;
  uint32_t count;
  Descriptor *extendee;
  undefined1 local_108 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_100;
  DescriptorPool *local_f8;
  FieldDescriptor *pFStack_f0;
  FieldDescriptor *local_e8;
  TcParseTableBase *pTStack_e0;
  uint32_t *local_d8;
  undefined1 local_cc [4];
  undefined1 auStack_c8 [40];
  uint32_t *local_a0;
  ReflectionSchema *local_98;
  undefined1 local_8c [4];
  MapDynamicFieldInfo<google::protobuf::Message> local_88;
  FieldDescriptor *local_58;
  MapFieldBase *local_50;
  VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test *local_48;
  undefined1 local_40 [16];
  
  this_02._M_head_impl = (LogMessageData *)(this->super_VisitFieldsTest).message_;
  auStack_c8._0_4_ = 0xffffffff;
  MVar21 = Message::GetMetadata((Message *)this_02._M_head_impl);
  pRVar15 = MVar21.reflection;
  if (0 < (pRVar15->schema_).weak_field_map_offset_) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_01._M_str = "weak fields are not supported";
    str_01._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_01);
LAB_008fc720:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_108);
  }
  local_48 = this;
  if ((pRVar15->schema_).has_bits_offset_ == -1) {
    local_d8 = (uint32_t *)0x0;
  }
  else {
    local_d8 = Reflection::GetHasBits(pRVar15,(Message *)this_02._M_head_impl);
  }
  pDVar4 = pRVar15->descriptor_;
  iVar3 = pDVar4->field_count_;
  if (0 < (long)iVar3) {
    local_98 = &pRVar15->schema_;
    local_a0 = (pRVar15->schema_).has_bit_indices_;
    lVar20 = 0;
    lVar16 = 0;
    do {
      if (lVar16 < pDVar4->field_count_) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar16,(long)pDVar4->field_count_,"index < field_count()");
      }
      if (pcVar13 != (Nonnull<const_char_*>)0x0) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008fc65a:
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
        goto LAB_008fc667;
      }
      pFVar8 = pDVar4->fields_;
      if (*(char *)(*(long *)((long)&pFVar8->options_ + lVar20) + 0x87) == '\x01') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        str._M_str = "weak fields are not supported";
        str._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)local_108,str);
        goto LAB_008fc720;
      }
      if ((auStack_c8._0_4_ != 0xffffffff) &&
         (((uint)auStack_c8._0_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar8->type_)[lVar20] * 4) &
           0x1f) & 1) == 0)) goto LAB_008fbcd4;
      bVar2 = (&pFVar8->field_0x1)[lVar20];
      bVar14 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar14) {
        pcVar13 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar14,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar13 != (Nonnull<const_char_*>)0x0) goto LAB_008fc65a;
      this_00 = (DescriptorPool *)(&pFVar8->super_SymbolBase + lVar20);
      if (((&pFVar8->field_0x1)[lVar20] & 0x20) == 0) {
        bVar14 = ReflectionSchema::InRealOneof(local_98,(FieldDescriptor *)this_00);
        if (bVar14) {
          lVar5 = *(long *)((long)&pFVar8->scope_ + lVar20);
          if (lVar5 == 0) goto LAB_008fc687;
          if ((ulong)*(uint *)((long)&((this_02._M_head_impl)->entry).full_filename_._M_len +
                              (long)((int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x48)
                                                  ) >> 3) * -0x49249249) * 4 +
                              (ulong)(uint)(pRVar15->schema_).oneof_case_offset_) !=
              (long)*(int *)((long)&pFVar8->number_ + lVar20)) goto LAB_008fbcd4;
          switch((&pFVar8->type_)[lVar20]) {
          case '\t':
          case '\f':
            CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)this_00);
            if (((CVar6 != kView) && (CVar6 != kString)) && (CVar6 != kCord)) break;
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
            Reflection::ClearOneofField
                      (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
            break;
          case '\n':
          case '\v':
            goto switchD_008fb94b_caseD_a;
          default:
            goto switchD_008fb94b_default;
          }
        }
        else if ((local_d8 == (uint32_t *)0x0) || (uVar19 = local_a0[lVar16], uVar19 == 0xffffffff))
        {
          bVar14 = Reflection::HasFieldSingular
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          if (bVar14) goto LAB_008fba0d;
        }
        else if ((local_d8[uVar19 >> 5] >> (uVar19 & 0x1f) & 1) != 0) {
LAB_008fba0d:
          switch((&pFVar8->type_)[lVar20]) {
          case '\t':
          case '\f':
            CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)this_00);
            if (((CVar6 != kView) && (CVar6 != kString)) && (CVar6 != kCord)) break;
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\n':
          case '\v':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
switchD_008fb94b_caseD_a:
            Reflection::ClearField
                      (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
            break;
          default:
            goto switchD_008fba2c_default;
          }
        }
      }
      else {
        switch((&pFVar8->type_)[lVar20]) {
        case '\x01':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double> *)
                       local_108);
          }
          break;
        case '\x02':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float> *)
                       local_108);
          }
          break;
        case '\x03':
        case '\x10':
        case '\x12':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long> *)
                       local_108);
          }
          break;
        case '\x04':
        case '\x06':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                        *)local_108);
          }
          break;
        case '\x05':
        case '\x0e':
        case '\x0f':
        case '\x11':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int> *)
                       local_108);
          }
          break;
        case '\a':
        case '\r':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                        *)local_108);
          }
          break;
        case '\b':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                             (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])pRVar15;
            _Stack_100._M_head_impl = this_02._M_head_impl;
            local_f8 = this_00;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool> *)
                       local_108);
          }
          break;
        case '\t':
        case '\f':
          CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)this_00);
          if ((CVar6 - kView < 3) &&
             (pRVar12 = Reflection::
                        GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                  (pRVar15,(Message *)this_02._M_head_impl,
                                   (FieldDescriptor *)this_00),
             (pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0)) {
            pRVar9 = (RepeatedPtrFieldBase *)
                     Reflection::MutableRawRepeatedString
                               (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00,
                                true);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar9);
          }
          break;
        case '\n':
LAB_008fbba6:
          pRVar10 = Reflection::
                    GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          if ((pRVar10->super_RepeatedPtrFieldBase).current_size_ != 0) {
            pRVar9 = (RepeatedPtrFieldBase *)
                     Reflection::MutableRawRepeatedField
                               (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00,
                                CPPTYPE_MESSAGE,-1,(Descriptor *)0x0);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar9)
            ;
          }
          break;
        case '\v':
          bVar14 = FieldDescriptor::is_map_message_type((FieldDescriptor *)this_00);
          if (!bVar14) goto LAB_008fbba6;
          local_50 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                               (pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00);
          iVar7 = MapFieldBase::size(local_50);
          if (iVar7 != 0) {
            this_04 = FieldDescriptor::message_type((FieldDescriptor *)this_00);
            local_58 = Descriptor::map_key(this_04);
            pFVar8 = Descriptor::map_value(this_04);
            MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (&local_88,pRVar15,(Message *)this_02._M_head_impl,(FieldDescriptor *)this_00,
                       local_58,pFVar8,local_50);
            local_e8 = local_88.value;
            pTStack_e0 = (TcParseTableBase *)local_88.const_map_field;
            local_f8 = (DescriptorPool *)local_88.field;
            pFStack_f0 = local_88.key;
            local_108 = (undefined1  [8])local_88.reflection;
            _Stack_100._M_head_impl = (LogMessageData *)local_88.message;
            MapDynamicFieldInfo<google::protobuf::Message>::Clear
                      ((MapDynamicFieldInfo<google::protobuf::Message> *)local_108);
          }
          break;
        default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
          goto switchD_008fc123_default;
        }
      }
LAB_008fbcd4:
      lVar16 = lVar16 + 1;
      lVar20 = lVar20 + 0x58;
    } while (iVar3 != lVar16);
  }
  if ((pRVar15->schema_).extensions_offset_ != -1) {
    pEVar11 = Reflection::MutableExtensionSet(pRVar15,(Message *)this_02._M_head_impl);
    local_40._8_8_ = pRVar15->descriptor_;
    auStack_c8._32_8_ = local_40 + 8;
    local_40._0_8_ = pRVar15->descriptor_pool_;
    auStack_c8._24_8_ = local_40;
    auStack_c8._8_8_ = auStack_c8;
    auStack_c8._16_8_ = local_cc;
    lVar16 = (long)(short)pEVar11->flat_size_;
    pKVar17 = (pEVar11->map_).flat;
    if (lVar16 < 0) {
      internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
    }
    else {
      lVar20 = lVar16 * 0x20;
      pKVar1 = pKVar17 + lVar16;
      pKVar18 = pKVar17;
      local_108 = (undefined1  [8])auStack_c8._8_8_;
      _Stack_100._M_head_impl = (LogMessageData *)auStack_c8._16_8_;
      local_f8 = (DescriptorPool *)auStack_c8._24_8_;
      pFStack_f0 = (FieldDescriptor *)auStack_c8._32_8_;
      if (pEVar11->flat_size_ != 0) {
        uVar19 = 0;
        do {
          lVar20 = lVar20 + -0x20;
          ExtensionSet::Extension::PrefetchPtr(&pKVar18->second);
          pKVar18 = pKVar18 + 1;
          if (lVar20 == 0) break;
          bVar14 = uVar19 < 0xf;
          uVar19 = uVar19 + 1;
        } while (bVar14);
      }
      if (pKVar18 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar17->first,&pKVar17->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar18->second);
          pKVar17 = pKVar17 + 1;
          pKVar18 = pKVar18 + 1;
        } while (pKVar18 != pKVar1);
      }
      if (pKVar17 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar17->first,&pKVar17->second);
          pKVar17 = pKVar17 + 1;
        } while (pKVar17 != pKVar1);
      }
    }
  }
  auStack_c8._0_8_ = local_8c;
  local_8c = (undefined1  [4])0x0;
  this_03 = (local_48->super_VisitFieldsTest).message_;
  local_cc = (undefined1  [4])0xffffffff;
  MVar21 = Message::GetMetadata(this_03);
  pRVar15 = MVar21.reflection;
  if (0 < (pRVar15->schema_).weak_field_map_offset_) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_02._M_str = "weak fields are not supported";
    str_02._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_02);
    goto LAB_008fc720;
  }
  if ((pRVar15->schema_).has_bits_offset_ == -1) {
    local_d8 = (uint32_t *)0x0;
  }
  else {
    local_d8 = Reflection::GetHasBits(pRVar15,this_03);
  }
  pDVar4 = pRVar15->descriptor_;
  iVar3 = pDVar4->field_count_;
  if ((long)iVar3 < 1) {
LAB_008fc32e:
    if ((pRVar15->schema_).extensions_offset_ != -1) {
      pEVar11 = Reflection::MutableExtensionSet(pRVar15,this_03);
      local_40._8_8_ = pRVar15->descriptor_;
      auStack_c8._32_8_ = local_40 + 8;
      local_40._0_8_ = pRVar15->descriptor_pool_;
      auStack_c8._24_8_ = local_40;
      auStack_c8._8_8_ = local_cc;
      auStack_c8._16_8_ = auStack_c8;
      lVar16 = (long)(short)pEVar11->flat_size_;
      pKVar17 = (pEVar11->map_).flat;
      if (lVar16 < 0) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
      }
      else {
        lVar20 = lVar16 * 0x20;
        pKVar1 = pKVar17 + lVar16;
        pKVar18 = pKVar17;
        local_88.reflection = (Reflection *)auStack_c8._8_8_;
        local_88.message = (Message *)auStack_c8._16_8_;
        local_88.field = (FieldDescriptor *)auStack_c8._24_8_;
        local_88.key = (FieldDescriptor *)auStack_c8._32_8_;
        if (pEVar11->flat_size_ != 0) {
          uVar19 = 0;
          do {
            lVar20 = lVar20 + -0x20;
            ExtensionSet::Extension::PrefetchPtr(&pKVar18->second);
            pKVar18 = pKVar18 + 1;
            if (lVar20 == 0) break;
            bVar14 = uVar19 < 0xf;
            uVar19 = uVar19 + 1;
          } while (bVar14);
        }
        if (pKVar18 != pKVar1) {
          do {
            ReflectionVisit::
            VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_88,pKVar17->first,&pKVar17->second);
            ExtensionSet::Extension::PrefetchPtr(&pKVar18->second);
            pKVar17 = pKVar17 + 1;
            pKVar18 = pKVar18 + 1;
          } while (pKVar18 != pKVar1);
        }
        if (pKVar17 != pKVar1) {
          do {
            ReflectionVisit::
            VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_88,pKVar17->first,&pKVar17->second);
            pKVar17 = pKVar17 + 1;
          } while (pKVar17 != pKVar1);
        }
      }
    }
    local_88.reflection = (Reflection *)((ulong)local_88.reflection & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)local_108,"count","0",(uint *)local_8c,(int *)&local_88);
    if (local_108[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_88);
      if (_Stack_100._M_head_impl == (LogMessageData *)0x0) {
        message = (_func_int **)(anon_var_dwarf_a12c75 + 5);
      }
      else {
        message = (_func_int **)((_Stack_100._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(auStack_c8 + 8),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
                 ,0x88,(char *)message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(auStack_c8 + 8),(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_c8 + 8));
      if (local_88.reflection != (Reflection *)0x0) {
        (**(code **)&(local_88.reflection)->descriptor_->field_count_)();
      }
    }
    if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_100._M_head_impl);
    }
    return;
  }
  local_98 = &pRVar15->schema_;
  local_a0 = (pRVar15->schema_).has_bit_indices_;
  lVar16 = 0;
  lVar20 = 0;
LAB_008fc010:
  if (lVar20 < pDVar4->field_count_) {
    pcVar13 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (lVar20,(long)pDVar4->field_count_,"index < field_count()");
  }
  if (pcVar13 != (Nonnull<const_char_*>)0x0) {
LAB_008fc667:
    internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008fc677:
    internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008fc687:
    protobuf_assumption_failed
              ("res != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb31);
  }
  pFVar8 = pDVar4->fields_;
  if (*(char *)(*(long *)((long)&pFVar8->options_ + lVar16) + 0x87) == '\x01') {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,0x6e,"!field->options().weak()");
    str_00._M_str = "weak fields are not supported";
    str_00._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_88,str_00);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_88);
  }
  if ((local_cc != (undefined1  [4])0xffffffff) &&
     (((uint)local_cc >>
       (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar8->type_)[lVar16] * 4) & 0x1f)
      & 1) == 0)) goto LAB_008fc290;
  bVar2 = (&pFVar8->field_0x1)[lVar16];
  bVar14 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar14) {
    pcVar13 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar13 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar14,0xbf < bVar2,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar13 != (Nonnull<const_char_*>)0x0) goto LAB_008fc677;
  this_01 = (FieldDescriptor *)(&pFVar8->super_SymbolBase + lVar16);
  if (((&pFVar8->field_0x1)[lVar16] & 0x20) == 0) {
    bVar14 = ReflectionSchema::InRealOneof(local_98,this_01);
    if (!bVar14) {
      if ((local_d8 != (uint32_t *)0x0) && (uVar19 = local_a0[lVar20], uVar19 != 0xffffffff)) {
        if ((local_d8[uVar19 >> 5] >> (uVar19 & 0x1f) & 1) != 0) goto LAB_008fc171;
        goto LAB_008fc290;
      }
      bVar14 = Reflection::HasFieldSingular(pRVar15,this_03,this_01);
      if (bVar14) {
LAB_008fc171:
        bVar2 = (&pFVar8->type_)[lVar16];
        if (bVar2 < 0x13) {
          if ((0x7edfeU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008fc289;
          if ((0x1200U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008fc19c;
        }
        goto LAB_008fc6ae;
      }
      goto LAB_008fc290;
    }
    lVar5 = *(long *)((long)&pFVar8->scope_ + lVar16);
    if (lVar5 == 0) goto LAB_008fc687;
    if ((ulong)*(uint *)((long)&(this_03->super_MessageLite)._vptr_MessageLite +
                        (long)((int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x48)) >> 3
                                    ) * -0x49249249) * 4 +
                        (ulong)(uint)(pRVar15->schema_).oneof_case_offset_) !=
        (long)*(int *)((long)&pFVar8->number_ + lVar16)) goto LAB_008fc290;
    bVar2 = (&pFVar8->type_)[lVar16];
    if (0x12 < bVar2) goto LAB_008fc6b8;
    if ((0x7edfeU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008fc289;
    if ((0x1200U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_008fc6b8;
LAB_008fc19c:
    CVar6 = FieldDescriptor::cpp_string_type(this_01);
    if (2 < CVar6 - kView) goto LAB_008fc290;
  }
  else {
    switch((&pFVar8->type_)[lVar16]) {
    case '\x01':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\x02':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\x03':
    case '\x10':
    case '\x12':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\x04':
    case '\x06':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\x05':
    case '\x0e':
    case '\x0f':
    case '\x11':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\a':
    case '\r':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\b':
      this_05 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                           (pRVar15,this_03,this_01)->soo_rep_;
      break;
    case '\t':
    case '\f':
      CVar6 = FieldDescriptor::cpp_string_type(this_01);
      if (CVar6 - kView < 3) {
        pRVar12 = Reflection::
                  GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            (pRVar15,this_03,this_01);
        goto LAB_008fc238;
      }
      goto LAB_008fc290;
    case '\n':
      goto switchD_008fc123_caseD_a;
    case '\v':
      bVar14 = FieldDescriptor::is_map_message_type(this_01);
      if (bVar14) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
        if ((extraout_RAX & 1) == 0) goto LAB_008fc289;
        goto LAB_008fc290;
      }
      goto switchD_008fc123_caseD_a;
    default:
      goto switchD_008fc123_default;
    }
    iVar7 = SooRep::size(this_05,(undefined1  [16])
                                 ((undefined1  [16])this_05->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
    if (iVar7 == 0) goto LAB_008fc290;
  }
LAB_008fc289:
  *(int *)auStack_c8._0_8_ = *(int *)auStack_c8._0_8_ + 1;
LAB_008fc290:
  lVar20 = lVar20 + 1;
  lVar16 = lVar16 + 0x58;
  if (iVar3 == lVar20) goto LAB_008fc32e;
  goto LAB_008fc010;
switchD_008fc123_caseD_a:
  pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)Reflection::
               GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                         (pRVar15,this_03,this_01);
LAB_008fc238:
  if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) goto LAB_008fc289;
  goto LAB_008fc290;
switchD_008fc123_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
switchD_008fba2c_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008fc6ae:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
switchD_008fb94b_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008fc6b8:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_c8 + 8));
  if (local_88.reflection != (Reflection *)0x0) {
    (**(code **)&(local_88.reflection)->descriptor_->field_count_)();
  }
  local_88.reflection = (Reflection *)0x0;
  if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_100._M_head_impl);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsRevisitNone) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; });

  EXPECT_EQ(count, 0);
}